

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O2

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info,string *command_name,
                         vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *objects_info,bool check_members,bool check_pnext,
                         XrRecommendedLayerResolutionGetInfoMETA *value)

{
  NextChainResult NVar1;
  XrResult XVar2;
  XrStructureType XVar3;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *this;
  XrCompositionLayerEquirect2KHR *value_00;
  allocator local_211;
  string local_210;
  string error_message;
  allocator local_1c9;
  string local_1c8;
  vector<XrStructureType,_std::allocator<XrStructureType>_> valid_ext_structs;
  vector<XrStructureType,_std::allocator<XrStructureType>_> duplicate_ext_structs;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_168;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_150;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_138;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_120;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_108;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_f0;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_d8;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_c0;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_a8;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_90;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_78;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_60;
  vector<XrStructureType,_std::allocator<XrStructureType>_> encountered_structs;
  
  XVar2 = XR_SUCCESS;
  if (value->type != XR_TYPE_RECOMMENDED_LAYER_RESOLUTION_GET_INFO_META) {
    XVar2 = XR_ERROR_VALIDATION_FAILURE;
    InvalidStructureType
              (instance_info,command_name,objects_info,"XrRecommendedLayerResolutionGetInfoMETA",
               value->type,"VUID-XrRecommendedLayerResolutionGetInfoMETA-type-type",
               XR_TYPE_RECOMMENDED_LAYER_RESOLUTION_GET_INFO_META,
               "XR_TYPE_RECOMMENDED_LAYER_RESOLUTION_GET_INFO_META");
  }
  if (check_pnext) {
    valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    encountered_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    encountered_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    encountered_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    NVar1 = ValidateNextChain(instance_info,command_name,objects_info,value->next,&valid_ext_structs
                              ,&encountered_structs,&duplicate_ext_structs);
    if (NVar1 == NEXT_CHAIN_RESULT_DUPLICATE_STRUCT) {
      std::__cxx11::string::string
                ((string *)&error_message,
                 "Multiple structures of the same type(s) in \"next\" chain for ",
                 (allocator *)&local_210);
      std::__cxx11::string::append((char *)&error_message);
      StructTypesToString_abi_cxx11_(&local_210,instance_info,&duplicate_ext_structs);
      std::__cxx11::string::append((string *)&error_message);
      std::__cxx11::string::~string((string *)&local_210);
      std::__cxx11::string::string
                ((string *)&local_210,"VUID-XrRecommendedLayerResolutionGetInfoMETA-next-unique",
                 &local_211);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 &local_78,objects_info);
      std::__cxx11::string::string
                ((string *)&local_1c8,
                 "Multiple structures of the same type(s) in \"next\" chain for XrRecommendedLayerResolutionGetInfoMETA struct"
                 ,&local_1c9);
      CoreValidLogMessage(instance_info,&local_210,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                          (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                           *)&local_78,&local_1c8);
      std::__cxx11::string::~string((string *)&local_1c8);
      std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
      ~_Vector_base(&local_78);
      std::__cxx11::string::~string((string *)&local_210);
LAB_00199654:
      std::__cxx11::string::~string((string *)&error_message);
      XVar2 = XR_ERROR_VALIDATION_FAILURE;
    }
    else if (NVar1 == NEXT_CHAIN_RESULT_ERROR) {
      std::__cxx11::string::string
                ((string *)&error_message,"VUID-XrRecommendedLayerResolutionGetInfoMETA-next-next",
                 (allocator *)&local_1c8);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 &local_60,objects_info);
      std::__cxx11::string::string
                ((string *)&local_210,
                 "Invalid structure(s) in \"next\" chain for XrRecommendedLayerResolutionGetInfoMETA struct \"next\""
                 ,&local_211);
      CoreValidLogMessage(instance_info,&error_message,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name
                          ,(vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                            *)&local_60,&local_210);
      std::__cxx11::string::~string((string *)&local_210);
      std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
      ~_Vector_base(&local_60);
      goto LAB_00199654;
    }
    std::_Vector_base<XrStructureType,_std::allocator<XrStructureType>_>::~_Vector_base
              (&encountered_structs.
                super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>);
    std::_Vector_base<XrStructureType,_std::allocator<XrStructureType>_>::~_Vector_base
              (&duplicate_ext_structs.
                super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>);
    std::_Vector_base<XrStructureType,_std::allocator<XrStructureType>_>::~_Vector_base
              (&valid_ext_structs.
                super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>);
  }
  if (!check_members || XVar2 != XR_SUCCESS) {
    return XVar2;
  }
  value_00 = (XrCompositionLayerEquirect2KHR *)value->layer;
  if (value_00 == (XrCompositionLayerEquirect2KHR *)0x0) {
    std::__cxx11::string::string
              ((string *)&error_message,
               "VUID-XrRecommendedLayerResolutionGetInfoMETA-layer-parameter",
               (allocator *)&local_1c8);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               &local_90,objects_info);
    std::__cxx11::string::string
              ((string *)&local_210,
               "XrRecommendedLayerResolutionGetInfoMETA contains invalid NULL for XrCompositionLayerBaseHeader \"layer\" which is not optional and must be non-NULL"
               ,(allocator *)&valid_ext_structs);
    CoreValidLogMessage(instance_info,&error_message,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                        (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *)&local_90,&local_210);
    std::__cxx11::string::~string((string *)&local_210);
    std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
    ~_Vector_base(&local_90);
    goto LAB_00199c78;
  }
  XVar3 = value_00->type;
  if (XVar3 == XR_TYPE_COMPOSITION_LAYER_PROJECTION) {
    XVar2 = ValidateXrStruct(instance_info,command_name,objects_info,true,true,
                             (XrCompositionLayerProjection *)value_00);
    if (XVar2 == XR_SUCCESS) {
      value_00 = (XrCompositionLayerEquirect2KHR *)value->layer;
      XVar3 = value_00->type;
      goto LAB_001997d5;
    }
    std::__cxx11::string::string
              ((string *)&error_message,
               "Structure XrRecommendedLayerResolutionGetInfoMETA member layer",
               (allocator *)&local_210);
    std::__cxx11::string::append((char *)&error_message);
    std::__cxx11::string::string
              ((string *)&local_210,"VUID-XrRecommendedLayerResolutionGetInfoMETA-layer-parameter",
               (allocator *)&local_1c8);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               &local_a8,objects_info);
    CoreValidLogMessage(instance_info,&local_210,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                        (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *)&local_a8,&error_message);
    this = &local_a8;
  }
  else {
LAB_001997d5:
    if (XVar3 == XR_TYPE_COMPOSITION_LAYER_QUAD) {
      XVar2 = ValidateXrStruct(instance_info,command_name,objects_info,true,true,
                               (XrCompositionLayerQuad *)value_00);
      if (XVar2 != XR_SUCCESS) {
        std::__cxx11::string::string
                  ((string *)&error_message,
                   "Structure XrRecommendedLayerResolutionGetInfoMETA member layer",
                   (allocator *)&local_210);
        std::__cxx11::string::append((char *)&error_message);
        std::__cxx11::string::string
                  ((string *)&local_210,
                   "VUID-XrRecommendedLayerResolutionGetInfoMETA-layer-parameter",
                   (allocator *)&local_1c8);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                  ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                   &local_c0,objects_info);
        CoreValidLogMessage(instance_info,&local_210,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                            (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                             *)&local_c0,&error_message);
        this = &local_c0;
        goto LAB_00199c69;
      }
      value_00 = (XrCompositionLayerEquirect2KHR *)value->layer;
      XVar3 = value_00->type;
    }
    if (XVar3 == XR_TYPE_COMPOSITION_LAYER_CUBE_KHR) {
      XVar2 = ValidateXrStruct(instance_info,command_name,objects_info,true,true,
                               (XrCompositionLayerCubeKHR *)value_00);
      if (XVar2 != XR_SUCCESS) {
        std::__cxx11::string::string
                  ((string *)&error_message,
                   "Structure XrRecommendedLayerResolutionGetInfoMETA member layer",
                   (allocator *)&local_210);
        std::__cxx11::string::append((char *)&error_message);
        std::__cxx11::string::string
                  ((string *)&local_210,
                   "VUID-XrRecommendedLayerResolutionGetInfoMETA-layer-parameter",
                   (allocator *)&local_1c8);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                  ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                   &local_d8,objects_info);
        CoreValidLogMessage(instance_info,&local_210,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                            (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                             *)&local_d8,&error_message);
        this = &local_d8;
        goto LAB_00199c69;
      }
      value_00 = (XrCompositionLayerEquirect2KHR *)value->layer;
      XVar3 = value_00->type;
    }
    if (XVar3 == XR_TYPE_COMPOSITION_LAYER_CYLINDER_KHR) {
      XVar2 = ValidateXrStruct(instance_info,command_name,objects_info,true,true,
                               (XrCompositionLayerCylinderKHR *)value_00);
      if (XVar2 != XR_SUCCESS) {
        std::__cxx11::string::string
                  ((string *)&error_message,
                   "Structure XrRecommendedLayerResolutionGetInfoMETA member layer",
                   (allocator *)&local_210);
        std::__cxx11::string::append((char *)&error_message);
        std::__cxx11::string::string
                  ((string *)&local_210,
                   "VUID-XrRecommendedLayerResolutionGetInfoMETA-layer-parameter",
                   (allocator *)&local_1c8);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                  ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                   &local_f0,objects_info);
        CoreValidLogMessage(instance_info,&local_210,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                            (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                             *)&local_f0,&error_message);
        this = &local_f0;
        goto LAB_00199c69;
      }
      value_00 = (XrCompositionLayerEquirect2KHR *)value->layer;
      XVar3 = value_00->type;
    }
    if (XVar3 == XR_TYPE_COMPOSITION_LAYER_EQUIRECT_KHR) {
      XVar2 = ValidateXrStruct(instance_info,command_name,objects_info,true,true,
                               (XrCompositionLayerEquirectKHR *)value_00);
      if (XVar2 != XR_SUCCESS) {
        std::__cxx11::string::string
                  ((string *)&error_message,
                   "Structure XrRecommendedLayerResolutionGetInfoMETA member layer",
                   (allocator *)&local_210);
        std::__cxx11::string::append((char *)&error_message);
        std::__cxx11::string::string
                  ((string *)&local_210,
                   "VUID-XrRecommendedLayerResolutionGetInfoMETA-layer-parameter",
                   (allocator *)&local_1c8);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                  ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                   &local_108,objects_info);
        CoreValidLogMessage(instance_info,&local_210,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                            (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                             *)&local_108,&error_message);
        this = &local_108;
        goto LAB_00199c69;
      }
      value_00 = (XrCompositionLayerEquirect2KHR *)value->layer;
      XVar3 = value_00->type;
    }
    if (XVar3 == XR_TYPE_COMPOSITION_LAYER_EQUIRECT2_KHR) {
      XVar2 = ValidateXrStruct(instance_info,command_name,objects_info,true,true,value_00);
      if (XVar2 != XR_SUCCESS) {
        std::__cxx11::string::string
                  ((string *)&error_message,
                   "Structure XrRecommendedLayerResolutionGetInfoMETA member layer",
                   (allocator *)&local_210);
        std::__cxx11::string::append((char *)&error_message);
        std::__cxx11::string::string
                  ((string *)&local_210,
                   "VUID-XrRecommendedLayerResolutionGetInfoMETA-layer-parameter",
                   (allocator *)&local_1c8);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                  ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                   &local_120,objects_info);
        CoreValidLogMessage(instance_info,&local_210,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                            (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                             *)&local_120,&error_message);
        this = &local_120;
        goto LAB_00199c69;
      }
      value_00 = (XrCompositionLayerEquirect2KHR *)value->layer;
      XVar3 = value_00->type;
    }
    if (XVar3 == XR_TYPE_COMPOSITION_LAYER_PASSTHROUGH_FB) {
      XVar2 = ValidateXrStruct(instance_info,command_name,objects_info,true,true,
                               (XrCompositionLayerPassthroughFB *)value_00);
      if (XVar2 != XR_SUCCESS) {
        std::__cxx11::string::string
                  ((string *)&error_message,
                   "Structure XrRecommendedLayerResolutionGetInfoMETA member layer",
                   (allocator *)&local_210);
        std::__cxx11::string::append((char *)&error_message);
        std::__cxx11::string::string
                  ((string *)&local_210,
                   "VUID-XrRecommendedLayerResolutionGetInfoMETA-layer-parameter",
                   (allocator *)&local_1c8);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                  ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                   &local_138,objects_info);
        CoreValidLogMessage(instance_info,&local_210,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                            (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                             *)&local_138,&error_message);
        this = &local_138;
        goto LAB_00199c69;
      }
      value_00 = (XrCompositionLayerEquirect2KHR *)value->layer;
      XVar3 = value_00->type;
    }
    if (XVar3 != XR_TYPE_COMPOSITION_LAYER_PASSTHROUGH_HTC) {
LAB_00199ca0:
      XVar2 = ValidateXrStruct(instance_info,command_name,objects_info,true,false,
                               (XrCompositionLayerBaseHeader *)value_00);
      if (XVar2 == XR_SUCCESS) {
        return XR_SUCCESS;
      }
      std::__cxx11::string::string
                ((string *)&error_message,
                 "VUID-XrRecommendedLayerResolutionGetInfoMETA-layer-parameter",
                 (allocator *)&local_1c8);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 &local_168,objects_info);
      std::__cxx11::string::string
                ((string *)&local_210,
                 "Structure XrRecommendedLayerResolutionGetInfoMETA member layer is invalid",
                 (allocator *)&valid_ext_structs);
      CoreValidLogMessage(instance_info,&error_message,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name
                          ,(vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                            *)&local_168,&local_210);
      std::__cxx11::string::~string((string *)&local_210);
      std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
      ~_Vector_base(&local_168);
      std::__cxx11::string::~string((string *)&error_message);
      return XVar2;
    }
    XVar2 = ValidateXrStruct(instance_info,command_name,objects_info,true,true,
                             (XrCompositionLayerPassthroughHTC *)value_00);
    if (XVar2 == XR_SUCCESS) {
      value_00 = (XrCompositionLayerEquirect2KHR *)value->layer;
      goto LAB_00199ca0;
    }
    std::__cxx11::string::string
              ((string *)&error_message,
               "Structure XrRecommendedLayerResolutionGetInfoMETA member layer",
               (allocator *)&local_210);
    std::__cxx11::string::append((char *)&error_message);
    std::__cxx11::string::string
              ((string *)&local_210,"VUID-XrRecommendedLayerResolutionGetInfoMETA-layer-parameter",
               (allocator *)&local_1c8);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               &local_150,objects_info);
    CoreValidLogMessage(instance_info,&local_210,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                        (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *)&local_150,&error_message);
    this = &local_150;
  }
LAB_00199c69:
  std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
  ~_Vector_base(this);
  std::__cxx11::string::~string((string *)&local_210);
LAB_00199c78:
  std::__cxx11::string::~string((string *)&error_message);
  return XR_ERROR_VALIDATION_FAILURE;
}

Assistant:

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info, const std::string &command_name,
                          std::vector<GenValidUsageXrObjectInfo>& objects_info, bool check_members, bool check_pnext,
                          const XrRecommendedLayerResolutionGetInfoMETA* value) {
    XrResult xr_result = XR_SUCCESS;
    (void)xr_result;
    (void)instance_info;
    (void)command_name;
    (void)objects_info;
    (void)check_members;
    (void)value;
    // Make sure the structure type is correct
    if (value->type != XR_TYPE_RECOMMENDED_LAYER_RESOLUTION_GET_INFO_META) {
        InvalidStructureType(instance_info, command_name, objects_info, "XrRecommendedLayerResolutionGetInfoMETA",
                             value->type, "VUID-XrRecommendedLayerResolutionGetInfoMETA-type-type", XR_TYPE_RECOMMENDED_LAYER_RESOLUTION_GET_INFO_META, "XR_TYPE_RECOMMENDED_LAYER_RESOLUTION_GET_INFO_META");
        xr_result = XR_ERROR_VALIDATION_FAILURE;
    }
    if (check_pnext) {
        std::vector<XrStructureType> valid_ext_structs;
        std::vector<XrStructureType> duplicate_ext_structs;
        std::vector<XrStructureType> encountered_structs;
        NextChainResult next_result = ValidateNextChain(instance_info, command_name, objects_info,
                                                         value->next, valid_ext_structs,
                                                         encountered_structs,
                                                         duplicate_ext_structs);
        // No valid extension structs for this 'next'.  Therefore, must be NULL
        // or only contain a list of valid extension structures.
        if (NEXT_CHAIN_RESULT_ERROR == next_result) {
            CoreValidLogMessage(instance_info, "VUID-XrRecommendedLayerResolutionGetInfoMETA-next-next",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info, "Invalid structure(s) in \"next\" chain for XrRecommendedLayerResolutionGetInfoMETA struct \"next\"");
            xr_result = XR_ERROR_VALIDATION_FAILURE;
        } else if (NEXT_CHAIN_RESULT_DUPLICATE_STRUCT == next_result) {
            std::string error_message = "Multiple structures of the same type(s) in \"next\" chain for ";
            error_message += "XrRecommendedLayerResolutionGetInfoMETA : ";
            error_message += StructTypesToString(instance_info, duplicate_ext_structs);
            CoreValidLogMessage(instance_info, "VUID-XrRecommendedLayerResolutionGetInfoMETA-next-unique",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info,
            "Multiple structures of the same type(s) in \"next\" chain for XrRecommendedLayerResolutionGetInfoMETA struct");
            xr_result = XR_ERROR_VALIDATION_FAILURE;
        }
    }
    // If we are not to check the rest of the members, just return here.
    if (!check_members || XR_SUCCESS != xr_result) {
        return xr_result;
    }
    // Non-optional pointer/array variable that needs to not be NULL
    if (nullptr == value->layer) {
        CoreValidLogMessage(instance_info, "VUID-XrRecommendedLayerResolutionGetInfoMETA-layer-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name, objects_info,
                            "XrRecommendedLayerResolutionGetInfoMETA contains invalid NULL for XrCompositionLayerBaseHeader \"layer\" which is not "
                            "optional and must be non-NULL");
        return XR_ERROR_VALIDATION_FAILURE;
    }
    // Validate if XrCompositionLayerBaseHeader is a child structure of type XrCompositionLayerProjection and it is valid
    {
        const XrCompositionLayerProjection* new_compositionlayerprojection_value = reinterpret_cast<const XrCompositionLayerProjection*>(value->layer);
        if (new_compositionlayerprojection_value->type == XR_TYPE_COMPOSITION_LAYER_PROJECTION) {
            xr_result = ValidateXrStruct(instance_info, command_name,
                                                            objects_info, check_members, true, new_compositionlayerprojection_value);
            if (XR_SUCCESS != xr_result) {
                std::string error_message = "Structure XrRecommendedLayerResolutionGetInfoMETA member layer";
                error_message += " is invalid";
                CoreValidLogMessage(instance_info, "VUID-XrRecommendedLayerResolutionGetInfoMETA-layer-parameter",
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                    objects_info,
                                    error_message);
                return XR_ERROR_VALIDATION_FAILURE;
            }
        }
    }
    // Validate if XrCompositionLayerBaseHeader is a child structure of type XrCompositionLayerQuad and it is valid
    {
        const XrCompositionLayerQuad* new_compositionlayerquad_value = reinterpret_cast<const XrCompositionLayerQuad*>(value->layer);
        if (new_compositionlayerquad_value->type == XR_TYPE_COMPOSITION_LAYER_QUAD) {
            xr_result = ValidateXrStruct(instance_info, command_name,
                                                            objects_info, check_members, true, new_compositionlayerquad_value);
            if (XR_SUCCESS != xr_result) {
                std::string error_message = "Structure XrRecommendedLayerResolutionGetInfoMETA member layer";
                error_message += " is invalid";
                CoreValidLogMessage(instance_info, "VUID-XrRecommendedLayerResolutionGetInfoMETA-layer-parameter",
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                    objects_info,
                                    error_message);
                return XR_ERROR_VALIDATION_FAILURE;
            }
        }
    }
    // Validate if XrCompositionLayerBaseHeader is a child structure of type XrCompositionLayerCubeKHR and it is valid
    {
        const XrCompositionLayerCubeKHR* new_compositionlayercubekhr_value = reinterpret_cast<const XrCompositionLayerCubeKHR*>(value->layer);
        if (new_compositionlayercubekhr_value->type == XR_TYPE_COMPOSITION_LAYER_CUBE_KHR) {
            xr_result = ValidateXrStruct(instance_info, command_name,
                                                            objects_info, check_members, true, new_compositionlayercubekhr_value);
            if (XR_SUCCESS != xr_result) {
                std::string error_message = "Structure XrRecommendedLayerResolutionGetInfoMETA member layer";
                error_message += " is invalid";
                CoreValidLogMessage(instance_info, "VUID-XrRecommendedLayerResolutionGetInfoMETA-layer-parameter",
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                    objects_info,
                                    error_message);
                return XR_ERROR_VALIDATION_FAILURE;
            }
        }
    }
    // Validate if XrCompositionLayerBaseHeader is a child structure of type XrCompositionLayerCylinderKHR and it is valid
    {
        const XrCompositionLayerCylinderKHR* new_compositionlayercylinderkhr_value = reinterpret_cast<const XrCompositionLayerCylinderKHR*>(value->layer);
        if (new_compositionlayercylinderkhr_value->type == XR_TYPE_COMPOSITION_LAYER_CYLINDER_KHR) {
            xr_result = ValidateXrStruct(instance_info, command_name,
                                                            objects_info, check_members, true, new_compositionlayercylinderkhr_value);
            if (XR_SUCCESS != xr_result) {
                std::string error_message = "Structure XrRecommendedLayerResolutionGetInfoMETA member layer";
                error_message += " is invalid";
                CoreValidLogMessage(instance_info, "VUID-XrRecommendedLayerResolutionGetInfoMETA-layer-parameter",
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                    objects_info,
                                    error_message);
                return XR_ERROR_VALIDATION_FAILURE;
            }
        }
    }
    // Validate if XrCompositionLayerBaseHeader is a child structure of type XrCompositionLayerEquirectKHR and it is valid
    {
        const XrCompositionLayerEquirectKHR* new_compositionlayerequirectkhr_value = reinterpret_cast<const XrCompositionLayerEquirectKHR*>(value->layer);
        if (new_compositionlayerequirectkhr_value->type == XR_TYPE_COMPOSITION_LAYER_EQUIRECT_KHR) {
            xr_result = ValidateXrStruct(instance_info, command_name,
                                                            objects_info, check_members, true, new_compositionlayerequirectkhr_value);
            if (XR_SUCCESS != xr_result) {
                std::string error_message = "Structure XrRecommendedLayerResolutionGetInfoMETA member layer";
                error_message += " is invalid";
                CoreValidLogMessage(instance_info, "VUID-XrRecommendedLayerResolutionGetInfoMETA-layer-parameter",
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                    objects_info,
                                    error_message);
                return XR_ERROR_VALIDATION_FAILURE;
            }
        }
    }
    // Validate if XrCompositionLayerBaseHeader is a child structure of type XrCompositionLayerEquirect2KHR and it is valid
    {
        const XrCompositionLayerEquirect2KHR* new_compositionlayerequirect2khr_value = reinterpret_cast<const XrCompositionLayerEquirect2KHR*>(value->layer);
        if (new_compositionlayerequirect2khr_value->type == XR_TYPE_COMPOSITION_LAYER_EQUIRECT2_KHR) {
            xr_result = ValidateXrStruct(instance_info, command_name,
                                                            objects_info, check_members, true, new_compositionlayerequirect2khr_value);
            if (XR_SUCCESS != xr_result) {
                std::string error_message = "Structure XrRecommendedLayerResolutionGetInfoMETA member layer";
                error_message += " is invalid";
                CoreValidLogMessage(instance_info, "VUID-XrRecommendedLayerResolutionGetInfoMETA-layer-parameter",
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                    objects_info,
                                    error_message);
                return XR_ERROR_VALIDATION_FAILURE;
            }
        }
    }
    // Validate if XrCompositionLayerBaseHeader is a child structure of type XrCompositionLayerPassthroughFB and it is valid
    {
        const XrCompositionLayerPassthroughFB* new_compositionlayerpassthroughfb_value = reinterpret_cast<const XrCompositionLayerPassthroughFB*>(value->layer);
        if (new_compositionlayerpassthroughfb_value->type == XR_TYPE_COMPOSITION_LAYER_PASSTHROUGH_FB) {
            xr_result = ValidateXrStruct(instance_info, command_name,
                                                            objects_info, check_members, true, new_compositionlayerpassthroughfb_value);
            if (XR_SUCCESS != xr_result) {
                std::string error_message = "Structure XrRecommendedLayerResolutionGetInfoMETA member layer";
                error_message += " is invalid";
                CoreValidLogMessage(instance_info, "VUID-XrRecommendedLayerResolutionGetInfoMETA-layer-parameter",
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                    objects_info,
                                    error_message);
                return XR_ERROR_VALIDATION_FAILURE;
            }
        }
    }
    // Validate if XrCompositionLayerBaseHeader is a child structure of type XrCompositionLayerPassthroughHTC and it is valid
    {
        const XrCompositionLayerPassthroughHTC* new_compositionlayerpassthroughhtc_value = reinterpret_cast<const XrCompositionLayerPassthroughHTC*>(value->layer);
        if (new_compositionlayerpassthroughhtc_value->type == XR_TYPE_COMPOSITION_LAYER_PASSTHROUGH_HTC) {
            xr_result = ValidateXrStruct(instance_info, command_name,
                                                            objects_info, check_members, true, new_compositionlayerpassthroughhtc_value);
            if (XR_SUCCESS != xr_result) {
                std::string error_message = "Structure XrRecommendedLayerResolutionGetInfoMETA member layer";
                error_message += " is invalid";
                CoreValidLogMessage(instance_info, "VUID-XrRecommendedLayerResolutionGetInfoMETA-layer-parameter",
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                    objects_info,
                                    error_message);
                return XR_ERROR_VALIDATION_FAILURE;
            }
        }
    }
    // Validate that the base-structure XrCompositionLayerBaseHeader is valid
    xr_result = ValidateXrStruct(instance_info, command_name, objects_info,
                                                     check_members, true, value->layer);
    if (XR_SUCCESS != xr_result) {
        CoreValidLogMessage(instance_info, "VUID-XrRecommendedLayerResolutionGetInfoMETA-layer-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info,
                            "Structure XrRecommendedLayerResolutionGetInfoMETA member layer is invalid");
        return xr_result;
    }
    // Everything checked out properly
    return xr_result;
}